

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint8_t * cfd::core::ConfidentialTransaction::CopyConfidentialCommitment
                    (void *buffer,size_t buffer_size,size_t explicit_size,uint8_t *address)

{
  uint8_t *puVar1;
  size_t max_size;
  uint8_t ct_buffer [33];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28;
  
  if ((buffer_size == 0 || buffer == (void *)0x0) ||
     ((*buffer != '\x01' && (explicit_size = 0x21, *buffer == '\0')))) {
    *address = '\0';
    puVar1 = address + 1;
  }
  else {
    if (explicit_size < buffer_size) {
      buffer_size = explicit_size;
    }
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_28 = 0;
    memcpy(&local_48,buffer,buffer_size);
    memcpy(address,&local_48,explicit_size);
    puVar1 = address + explicit_size;
  }
  return puVar1;
}

Assistant:

uint8_t *ConfidentialTransaction::CopyConfidentialCommitment(
    const void *buffer, size_t buffer_size, size_t explicit_size,
    uint8_t *address) {
  uint8_t *result = address;
  const uint8_t *buffer_addr = static_cast<const uint8_t *>(buffer);
  if ((!buffer_addr) || (buffer_size == 0) || (buffer_addr[0] == 0)) {
    *result = 0;  // version is 0
    ++result;
  } else {
    size_t max_size = kConfidentialDataSize;
    if (buffer_addr[0] == kConfidentialVersion_1) {
      max_size = explicit_size;
    }
    size_t copy_size = max_size;
    if (buffer_size <= copy_size) {
      copy_size = buffer_size;
    }
    // explicit value
    // confidential value
    uint8_t ct_buffer[kConfidentialDataSize];
    memset(ct_buffer, 0, sizeof(ct_buffer));
    memcpy(ct_buffer, buffer_addr, copy_size);
    memcpy(address, ct_buffer, max_size);
    result += max_size;
  }
  return result;
}